

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O1

int nettlp_msg_get_msix_table(in_addr addr,nettlp_msix *msix,int msix_count)

{
  int __fd;
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int req;
  pollfd x [1];
  undefined4 local_24;
  pollfd local_20;
  
  __fd = nettlp_msg_socket(addr);
  if (__fd < 1) {
    return 0;
  }
  local_24 = 3;
  write(__fd,&local_24,4);
  local_20.events = 1;
  local_20.fd = __fd;
  iVar1 = poll(&local_20,1,500);
  if (iVar1 == 0) {
    piVar3 = __errno_location();
    *piVar3 = 0x3e;
  }
  else {
    sVar2 = read(__fd,msix,(long)msix_count * 0xc);
    iVar1 = 0;
    if (-1 < (int)sVar2) goto LAB_00103433;
  }
  iVar1 = -1;
LAB_00103433:
  close(__fd);
  return iVar1;
}

Assistant:

int nettlp_msg_get_msix_table(struct in_addr addr, struct nettlp_msix *msix,
			      int msix_count)
{
	int sock, req, ret = 0;
	struct pollfd x[1];

	sock = nettlp_msg_socket(addr);
	if (sock < 1)
		return 0;

	/* send GET_BAR4 request */
	req = NETTLP_MSG_GET_MSIX_TABLE;
	ret = write(sock, &req, sizeof(req));

	/* recv response with timeout */
	x[0].fd = sock;
	x[0].events = POLLIN;

	ret = poll(x, 1, LIBTLP_CPL_TIMEOUT);
	if (ret == 0) {
		errno = ETIME;
		goto err_out;
	}

	ret = read(sock, msix, sizeof(struct nettlp_msix) * msix_count);
	if (ret < 0)
		goto err_out;

	close(sock);
	return 0;

err_out:
	close(sock);
	return -1;
}